

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DFA.hpp
# Opt level: O1

void __thiscall
Centaurus::DFA<unsigned_char>::DFA
          (DFA<unsigned_char> *this,NFA<unsigned_char> *nfa,bool optimize_flag)

{
  vector<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
  *this_00;
  pointer pDVar1;
  pointer pNVar2;
  pointer pNVar3;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> _Var4;
  DFAState<unsigned_char> *state;
  pointer this_01;
  bool long_flag;
  vector<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
  *__range2;
  set<int,_std::less<int>,_std::allocator<int>_> ec0;
  bool local_8a;
  allocator_type local_89;
  vector<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
  *local_88;
  undefined1 local_80 [8];
  pointer local_78;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_60;
  
  this_00 = &(this->super_NFABase<Centaurus::DFAState<unsigned_char>_>).m_states;
  (this->super_NFABase<Centaurus::DFAState<unsigned_char>_>).m_states.
  super__Vector_base<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_NFABase<Centaurus::DFAState<unsigned_char>_>).m_states.
  super__Vector_base<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_NFABase<Centaurus::DFAState<unsigned_char>_>).m_states.
  super__Vector_base<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_NFABase<Centaurus::DFAState<unsigned_char>_>)._vptr_NFABase =
       (_func_int **)&PTR__NFABase_001bfcd8;
  local_8a = false;
  local_88 = this_00;
  NFA<unsigned_char>::epsilon_closure
            ((set<int,_std::less<int>,_std::allocator<int>_> *)&local_60,nfa,0,&local_8a);
  std::vector<int,std::allocator<int>>::vector<std::_Rb_tree_const_iterator<int>,void>
            ((vector<int,std::allocator<int>> *)&local_78,
             (_Rb_tree_const_iterator<int>)local_60._M_impl.super__Rb_tree_header._M_header._M_left,
             (_Rb_tree_const_iterator<int>)&local_60._M_impl.super__Rb_tree_header,&local_89);
  local_80 = (undefined1  [8])&PTR__IndexVector_001bed10;
  std::vector<Centaurus::DFAState<unsigned_char>,std::allocator<Centaurus::DFAState<unsigned_char>>>
  ::emplace_back<Centaurus::IndexVector,bool&>
            ((vector<Centaurus::DFAState<unsigned_char>,std::allocator<Centaurus::DFAState<unsigned_char>>>
              *)this_00,(IndexVector *)local_80,&local_8a);
  if (local_78 != (pointer)0x0) {
    operator_delete(local_78);
  }
  fork_states(this,0,nfa);
  this_01 = (this->super_NFABase<Centaurus::DFAState<unsigned_char>_>).m_states.
            super__Vector_base<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pDVar1 = (this->super_NFABase<Centaurus::DFAState<unsigned_char>_>).m_states.
           super__Vector_base<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (this_01 != pDVar1) {
    pNVar2 = (nfa->super_NFABase<Centaurus::NFABaseState<unsigned_char,_int>_>).m_states.
             super__Vector_base<Centaurus::NFABaseState<unsigned_char,_int>,_std::allocator<Centaurus::NFABaseState<unsigned_char,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pNVar3 = (nfa->super_NFABase<Centaurus::NFABaseState<unsigned_char,_int>_>).m_states.
             super__Vector_base<Centaurus::NFABaseState<unsigned_char,_int>,_std::allocator<Centaurus::NFABaseState<unsigned_char,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_80._0_4_ = (int)((ulong)((long)pNVar2 - (long)pNVar3) >> 3) * -0x33333333 + -1;
      _Var4 = std::
              __find_if<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                        ((this_01->super_NFABaseState<unsigned_char,_Centaurus::IndexVector>).
                         m_label.super_vector<int,_std::allocator<int>_>.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start,
                         (this_01->super_NFABaseState<unsigned_char,_Centaurus::IndexVector>).
                         m_label.super_vector<int,_std::allocator<int>_>.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish,local_80);
      if (_Var4._M_current !=
          (this_01->super_NFABaseState<unsigned_char,_Centaurus::IndexVector>).m_label.
          super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        this_01->m_accept = true;
      }
      NFABaseState<unsigned_char,_Centaurus::IndexVector>::sort
                (&this_01->super_NFABaseState<unsigned_char,_Centaurus::IndexVector>);
      this_01 = this_01 + 1;
    } while (this_01 != pDVar1);
  }
  if (optimize_flag) {
    minimize(this);
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_60);
  return;
}

Assistant:

DFA(const NFA<TCHAR>& nfa, bool optimize_flag = true)
	{
		//Start by collecting the epsilon closure of start state
        bool long_flag = false;
		std::set<int> ec0 = nfa.epsilon_closure(0, long_flag);

		//Create the start state
		m_states.emplace_back(IndexVector(ec0.cbegin(), ec0.cend()), long_flag);

		//Recursively construct the DFA
		fork_states(0, nfa);

		int accept_state_index = nfa.get_state_num() - 1;

		for (auto& state : m_states)
		{
			if (state.label().includes(accept_state_index))
			{
				//state.add_transition(CharClass<TCHAR>(), -1);
				state.set_accept();
			}

            state.sort();
		}

        if (optimize_flag)
            minimize();
	}